

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Monthly.cpp
# Opt level: O0

void OnPreUpdateLadder(LadderDatabase *database,Server *param_2,TeamType *param_3)

{
  tm *ptVar1;
  tm *tm_ptr;
  time_t current_time;
  TeamType *param_2_local;
  Server *param_1_local;
  LadderDatabase *database_local;
  
  current_time = (time_t)param_3;
  param_2_local = (TeamType *)param_2;
  param_1_local = (Server *)database;
  tm_ptr = (tm *)time((time_t *)0x0);
  ptVar1 = gmtime((time_t *)&tm_ptr);
  if (pluginInstance.last_sorted_month != ptVar1->tm_mon) {
    RenX::LadderDatabase::erase();
  }
  pluginInstance.last_sorted_month = ptVar1->tm_mon;
  return;
}

Assistant:

void OnPreUpdateLadder(RenX::LadderDatabase &database, RenX::Server &, const RenX::TeamType &) {
	time_t current_time = time(0);
	tm *tm_ptr = gmtime(&current_time);
	if (pluginInstance.last_sorted_month != tm_ptr->tm_mon) {
		database.erase();
	}
	pluginInstance.last_sorted_month = tm_ptr->tm_mon;
}